

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyfile.c
# Opt level: O3

econf_err getInt64ValueNum(econf_file key_file,size_t num,int64_t *result)

{
  econf_err eVar1;
  int *piVar2;
  longlong lVar3;
  char *local_30;
  
  piVar2 = __errno_location();
  *piVar2 = 0;
  lVar3 = strtoll(key_file.file_entry[num].value,&local_30,0);
  *result = lVar3;
  eVar1 = ECONF_VALUE_CONVERSION_ERROR;
  if ((local_30 != key_file.file_entry[num].value) &&
     ((*piVar2 == 0 || ((*piVar2 != 0x22 && (lVar3 != 0)))))) {
    eVar1 = ECONF_SUCCESS;
  }
  return eVar1;
}

Assistant:

econf_err getInt64ValueNum(econf_file key_file, size_t num, int64_t *result) {
  char *endptr;
  errno = 0;
  *result = strtoll(key_file.file_entry[num].value, &endptr, 0);
  if (endptr == key_file.file_entry[num].value || errno == ERANGE || (errno != 0 && *result == 0))
    return ECONF_VALUE_CONVERSION_ERROR;
  return ECONF_SUCCESS;
}